

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candela.cpp
# Opt level: O2

void candella::loop(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  duration in_RCX;
  nfds_t __nfds;
  size_t i;
  ulong uVar5;
  _Base_ptr __fds;
  int iVar6;
  _Base_ptr extraout_XMM0_Qa;
  backlight_adjuster adjuster;
  multimap<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type,_std::less<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_candella::action_type>_>_>
  timer_queue;
  ambient_light sensor;
  action_type local_2ec;
  undefined1 local_2e8 [44];
  int local_2bc;
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
  local_2b8 [8];
  _Rb_tree_node_base local_2b0;
  undefined8 local_290;
  ambient_light local_288;
  
  backlight_adjuster::backlight_adjuster((backlight_adjuster *)(local_2e8 + 0x18));
  ambient_light::ambient_light(&local_288,(string *)&DAT_00108230);
  local_2b0._M_left = &local_2b0;
  local_2b0._M_color = _S_red;
  local_2b0._M_parent = (_Base_ptr)0x0;
  local_290 = 0;
  local_2b0._M_right = local_2b0._M_left;
  local_2e8._0_8_ = std::chrono::_V2::system_clock::now();
  __fds = (_Base_ptr)local_2e8;
  local_2ec = BACKLIGHT_POLL;
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
  ::
  _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type>
            (local_2b8,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)__fds,&local_2ec);
  iVar6 = 0;
  local_2e8._8_8_ = (_Base_ptr)0x0;
  iVar1 = 0;
  do {
    std::this_thread::
    sleep_until<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)(local_2b0._M_left + 1));
    if (*(int *)&local_2b0._M_left[1]._M_parent == 1) {
      iVar2 = iVar1 + (int)local_2e8._8_8_;
      if (iVar6 <= iVar2) {
        iVar2 = iVar6;
      }
      if ((int)local_2e8._8_8_ == 0) {
        iVar2 = iVar6;
      }
      backlight_adjuster::set_brightness((backlight_adjuster *)(local_2e8 + 0x18),iVar2);
      iVar1 = iVar6;
      if (iVar2 != iVar6) {
        in_RCX.__r = std::chrono::_V2::system_clock::now();
        local_2e8._0_8_ = (DAT_00108220 / DAT_00108228) * 1000000 + in_RCX.__r;
        local_2ec = BACKLIGHT_FADE;
        std::
        _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
        ::
        _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>,candella::action_type>
                  (local_2b8,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
                    *)local_2e8,&local_2ec);
        iVar1 = iVar2;
      }
    }
    else if (*(int *)&local_2b0._M_left[1]._M_parent == 0) {
      ambient_light::poll(&local_288,(pollfd *)__fds,__nfds,(int)in_RCX.__r);
      local_2e8._16_8_ = extraout_XMM0_Qa;
      std::operator<<((ostream *)&std::cerr,"[info]: Ambient light value was ");
      poVar3 = std::ostream::_M_insert<double>((double)local_2e8._16_8_);
      std::operator<<(poVar3,"\n");
      iVar1 = backlight_adjuster::current_brightness((backlight_adjuster *)(local_2e8 + 0x18));
      poVar3 = std::operator<<((ostream *)&std::cerr,"[info]: current brightness ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
      std::operator<<(poVar3,"\n");
      iVar2 = configuration::desired_brightness
                        ((configuration *)&config,local_2bc,(double)local_2e8._16_8_);
      iVar6 = _DAT_00108254;
      if (_DAT_00108254 < iVar2) {
        iVar6 = iVar2;
      }
      if (iVar6 - iVar1 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"[info]: Adjusting brightness to ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar6);
        std::operator<<(poVar3,"\n");
        local_2e8._8_8_ = (ulong)(long)(iVar6 - iVar1) / DAT_00108228;
        for (uVar5 = 0; uVar5 < DAT_00108228; uVar5 = uVar5 + 1) {
          lVar4 = std::chrono::_V2::system_clock::now();
          local_2e8._0_8_ = ((DAT_00108220 * uVar5) / DAT_00108228) * 1000000 + lVar4;
          local_2ec = BACKLIGHT_FADE;
          std::
          _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
          ::
          _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<unsigned_long,std::ratio<1l,1000000000l>>>,candella::action_type>
                    (local_2b8,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<unsigned_long,_std::ratio<1L,_1000000000L>_>_>
                      *)local_2e8,&local_2ec);
        }
      }
      lVar4 = std::chrono::_V2::system_clock::now();
      in_RCX.__r = config * 1000000 + lVar4;
      local_2ec = BACKLIGHT_POLL;
      local_2e8._0_8_ = in_RCX.__r;
      std::
      _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
      ::
      _M_emplace_equal<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,candella::action_type>
                (local_2b8,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)local_2e8,&local_2ec);
    }
    __fds = local_2b0._M_left;
    std::
    _Rb_tree<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>,std::less<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,candella::action_type>>>
    ::erase_abi_cxx11_(local_2b8,(iterator)local_2b0._M_left);
  } while( true );
}

Assistant:

void loop()
{
    backlight_adjuster adjuster;
    ambient_light sensor{config.light_sensor};

    using steady_clock = std::chrono::system_clock;
    std::multimap<steady_clock::time_point, action_type> timer_queue;
    timer_queue.emplace(steady_clock::now(), action_type::BACKLIGHT_POLL);

    int32_t curr_bright = 0;
    int32_t new_bright = 0;
    int32_t step_size = 0;

    while (true)
    {
        std::this_thread::sleep_until(timer_queue.begin()->first);
        if (timer_queue.begin()->second == action_type::BACKLIGHT_POLL)
        {
            // read the current ambient light value
            auto ambient_light = sensor.poll();
            std::cerr << "[info]: Ambient light value was " << ambient_light
                      << "\n";

            // read the current backlight value
            curr_bright = adjuster.current_brightness();
            std::cerr << "[info]: current brightness " << curr_bright << "\n";

            // calculate the new brightness value
            new_bright = config.desired_brightness(adjuster.max_brightness(),
                                                   ambient_light);

            new_bright = std::max(new_bright, config.min_bright);

            if (curr_bright != new_bright)
            {
                std::cerr << "[info]: Adjusting brightness to " << new_bright
                          << "\n";
                step_size = (new_bright - curr_bright) / config.fade_steps;
                for (std::size_t i = 0; i < config.fade_steps; ++i)
                {
                    timer_queue.emplace(steady_clock::now()
                                            + i * config.fade_time
                                                  / config.fade_steps,
                                        action_type::BACKLIGHT_FADE);
                }
            }
            timer_queue.emplace(steady_clock::now() + config.poll_time,
                                action_type::BACKLIGHT_POLL);
        }
        else if (timer_queue.begin()->second == action_type::BACKLIGHT_FADE)
        {
            curr_bright += step_size;
            if (step_size == 0 || curr_bright > new_bright)
                curr_bright = new_bright;

            adjuster.set_brightness(curr_bright);
            if (curr_bright != new_bright)
            {
                timer_queue.emplace(steady_clock::now()
                                        + config.fade_time / config.fade_steps,
                                    action_type::BACKLIGHT_FADE);
            }
        }
        timer_queue.erase(timer_queue.begin());
    }
}